

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

longdouble *
calc_sd_right_to_left<long_double,float>
          (float *x,float xmean,size_t *ix_arr,size_t st,size_t end,double *sd_arr)

{
  longdouble lVar1;
  longdouble *extraout_RAX;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble lVar2;
  float in_XMM0_Da;
  size_t row;
  size_t n;
  longdouble mean_prev;
  longdouble running_ssq;
  longdouble running_mean;
  unkbyte10 local_c4;
  undefined8 local_78;
  
  for (local_78 = 0; local_78 < (ulong)(in_RCX - in_RDX); local_78 = local_78 + 1) {
    if (local_78 == 0) {
      local_c4 = (longdouble)0;
      lVar1 = in_ST0;
    }
    else {
      lVar2 = in_ST3;
      std::sqrt((double)(ulong)(uint)(*(float *)(in_RDI + *(long *)(in_RSI + (in_RCX - local_78) * 8
                                                                   ) * 4) - in_XMM0_Da));
      lVar1 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = lVar2;
      local_c4 = in_ST0;
    }
    in_ST0 = lVar1;
    *(double *)(in_R8 + ((in_RCX - in_RDX) - local_78) * 8) = (double)local_c4;
  }
  std::sqrt((double)(ulong)(uint)(*(float *)(in_RDI + *(long *)(in_RSI + in_RDX * 8) * 4) -
                                 in_XMM0_Da));
  return extraout_RAX;
}

Assistant:

real_t calc_sd_right_to_left(real_t_ *restrict x, real_t_ xmean, size_t ix_arr[], size_t st, size_t end, double *restrict sd_arr)
{
    real_t running_mean = 0;
    real_t running_ssq = 0;
    real_t mean_prev = x[ix_arr[end]] - xmean;
    size_t n = end - st + 1;
    for (size_t row = 0; row < n-1; row++)
    {
        running_mean   += ((x[ix_arr[end-row]] - xmean) - running_mean) / (real_t)(row+1);
        running_ssq    += ((x[ix_arr[end-row]] - xmean) - running_mean) * ((x[ix_arr[end-row]] - xmean) - mean_prev);
        mean_prev       =  running_mean;
        sd_arr[n-row-1] = (row == 0)? 0. : std::sqrt(running_ssq / (real_t)(row+1));
    }
    running_mean   += ((x[ix_arr[st]] - xmean) - running_mean) / (real_t)n;
    running_ssq    += ((x[ix_arr[st]] - xmean) - running_mean) * ((x[ix_arr[st]] - xmean) - mean_prev);
    return std::sqrt(running_ssq / (real_t)n);
}